

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bandpre.c
# Opt level: O1

int CVBandPrecInit(void *cvode_mem,sunindextype N,sunindextype mu,sunindextype ml)

{
  long lVar1;
  int iVar2;
  sunindextype *__ptr;
  SUNMatrix p_Var3;
  SUNLinearSolver p_Var4;
  long lVar5;
  int iVar6;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar6 = -1;
    cvode_mem = (CVodeMem)0x0;
    error_code = -1;
    iVar2 = 0x46;
  }
  else {
    lVar1 = *(long *)((long)cvode_mem + 0x410);
    if (lVar1 == 0) {
      msgfmt = "Linear solver memory is NULL. One of the SPILS linear solvers must be attached.";
      iVar6 = -2;
      error_code = -2;
      iVar2 = 0x4f;
    }
    else if (*(long *)(*(long *)(*(long *)((long)cvode_mem + 0xe0) + 8) + 0x28) == 0) {
      msgfmt = "A required vector operation is not implemented.";
      iVar6 = -3;
      error_code = -3;
      iVar2 = 0x58;
    }
    else {
      __ptr = (sunindextype *)malloc(0x50);
      if (__ptr == (sunindextype *)0x0) {
        msgfmt = "A memory request failed.";
        iVar6 = -4;
        error_code = -4;
        iVar2 = 0x62;
      }
      else {
        __ptr[9] = (sunindextype)cvode_mem;
        if (mu < 1) {
          mu = 0;
        }
        lVar5 = N + -1;
        if (N <= mu) {
          mu = lVar5;
        }
        *__ptr = N;
        if (ml < 1) {
          ml = 0;
        }
        __ptr[2] = mu;
        if (N <= ml) {
          ml = lVar5;
        }
        __ptr[1] = ml;
        __ptr[8] = 0;
        __ptr[3] = 0;
        p_Var3 = SUNBandMatrixStorage(N,mu,ml,mu,*cvode_mem);
        __ptr[3] = (sunindextype)p_Var3;
        if (p_Var3 == (SUNMatrix)0x0) {
          free(__ptr);
          msgfmt = "A memory request failed.";
          iVar6 = -4;
          error_code = -4;
          iVar2 = 0x77;
        }
        else {
          if (ml + mu < N) {
            lVar5 = ml + mu;
          }
          __ptr[4] = 0;
          p_Var3 = SUNBandMatrixStorage(N,mu,ml,lVar5,*cvode_mem);
          __ptr[4] = (sunindextype)p_Var3;
          if (p_Var3 == (SUNMatrix)0x0) {
            SUNMatDestroy(__ptr[3]);
            free(__ptr);
            msgfmt = "A memory request failed.";
            iVar6 = -4;
            error_code = -4;
            iVar2 = 0x85;
          }
          else {
            __ptr[5] = 0;
            p_Var4 = SUNLinSol_Band(*(N_Vector *)((long)cvode_mem + 0xe0),p_Var3,*cvode_mem);
            __ptr[5] = (sunindextype)p_Var4;
            if (p_Var4 == (SUNLinearSolver)0x0) {
              SUNMatDestroy(__ptr[4]);
              SUNMatDestroy(__ptr[3]);
              free(__ptr);
              msgfmt = "A memory request failed.";
              iVar6 = -4;
              error_code = -4;
              iVar2 = 0x93;
            }
            else {
              __ptr[6] = 0;
              lVar5 = N_VClone(*(undefined8 *)((long)cvode_mem + 0xe0));
              __ptr[6] = lVar5;
              if (lVar5 == 0) {
                SUNLinSolFree(__ptr[5]);
                SUNMatDestroy(__ptr[4]);
                SUNMatDestroy(__ptr[3]);
                free(__ptr);
                msgfmt = "A memory request failed.";
                iVar6 = -4;
                error_code = -4;
                iVar2 = 0xa2;
              }
              else {
                __ptr[7] = 0;
                lVar5 = N_VClone(*(undefined8 *)((long)cvode_mem + 0xe0));
                __ptr[7] = lVar5;
                if (lVar5 == 0) {
                  SUNLinSolFree(__ptr[5]);
                  SUNMatDestroy(__ptr[4]);
                  SUNMatDestroy(__ptr[3]);
                  N_VDestroy(__ptr[6]);
                  free(__ptr);
                  msgfmt = "A memory request failed.";
                  iVar6 = -4;
                  error_code = -4;
                  iVar2 = 0xb0;
                }
                else {
                  iVar2 = SUNLinSolInitialize();
                  if (iVar2 == 0) {
                    if (*(code **)(lVar1 + 0xe8) != (code *)0x0) {
                      (**(code **)(lVar1 + 0xe8))(cvode_mem);
                    }
                    *(sunindextype **)(lVar1 + 0xf0) = __ptr;
                    *(code **)(lVar1 + 0xe8) = CVBandPrecFree;
                    iVar2 = CVodeSetPreconditioner(cvode_mem,CVBandPrecSetup,CVBandPrecSolve);
                    return iVar2;
                  }
                  SUNLinSolFree(__ptr[5]);
                  SUNMatDestroy(__ptr[4]);
                  SUNMatDestroy(__ptr[3]);
                  N_VDestroy(__ptr[6]);
                  N_VDestroy(__ptr[7]);
                  free(__ptr);
                  msgfmt = "An error arose from a SUNBandLinearSolver routine.";
                  iVar6 = -9;
                  error_code = -9;
                  iVar2 = 0xc0;
                }
              }
            }
          }
        }
      }
    }
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar2,"CVBandPrecInit",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bandpre.c"
                 ,msgfmt);
  return iVar6;
}

Assistant:

int CVBandPrecInit(void* cvode_mem, sunindextype N, sunindextype mu,
                   sunindextype ml)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVBandPrecData pdata;
  sunindextype mup, mlp, storagemu;
  int flag;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Test if the CVLS linear solver interface has been attached */
  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBP_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* Test compatibility of NVECTOR package with the BAND preconditioner */
  if (cv_mem->cv_tempv->ops->nvgetarraypointer == NULL)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGBP_BAD_NVECTOR);
    return (CVLS_ILL_INPUT);
  }

  /* Allocate data memory */
  pdata = NULL;
  pdata = (CVBandPrecData)malloc(sizeof *pdata);
  if (pdata == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* Load pointers and bandwidths into pdata block. */
  pdata->cvode_mem = cvode_mem;
  pdata->N         = N;
  pdata->mu = mup = SUNMIN(N - 1, SUNMAX(0, mu));
  pdata->ml = mlp = SUNMIN(N - 1, SUNMAX(0, ml));

  /* Initialize nfeBP counter */
  pdata->nfeBP = 0;

  /* Allocate memory for saved banded Jacobian approximation. */
  pdata->savedJ = NULL;
  pdata->savedJ = SUNBandMatrixStorage(N, mup, mlp, mup, cv_mem->cv_sunctx);
  if (pdata->savedJ == NULL)
  {
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* Allocate memory for banded preconditioner. */
  storagemu     = SUNMIN(N - 1, mup + mlp);
  pdata->savedP = NULL;
  pdata->savedP = SUNBandMatrixStorage(N, mup, mlp, storagemu, cv_mem->cv_sunctx);
  if (pdata->savedP == NULL)
  {
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* Allocate memory for banded linear solver */
  pdata->LS = NULL;
  pdata->LS = SUNLinSol_Band(cv_mem->cv_tempv, pdata->savedP, cv_mem->cv_sunctx);
  if (pdata->LS == NULL)
  {
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* allocate memory for temporary N_Vectors */
  pdata->tmp1 = NULL;
  pdata->tmp1 = N_VClone(cv_mem->cv_tempv);
  if (pdata->tmp1 == NULL)
  {
    SUNLinSolFree(pdata->LS);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }
  pdata->tmp2 = NULL;
  pdata->tmp2 = N_VClone(cv_mem->cv_tempv);
  if (pdata->tmp2 == NULL)
  {
    SUNLinSolFree(pdata->LS);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    N_VDestroy(pdata->tmp1);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* initialize band linear solver object */
  flag = SUNLinSolInitialize(pdata->LS);
  if (flag != SUN_SUCCESS)
  {
    SUNLinSolFree(pdata->LS);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    N_VDestroy(pdata->tmp1);
    N_VDestroy(pdata->tmp2);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                   MSGBP_SUNLS_FAIL);
    return (CVLS_SUNLS_FAIL);
  }

  /* make sure P_data is free from any previous allocations */
  if (cvls_mem->pfree) { cvls_mem->pfree(cv_mem); }

  /* Point to the new P_data field in the LS memory */
  cvls_mem->P_data = pdata;

  /* Attach the pfree function */
  cvls_mem->pfree = CVBandPrecFree;

  /* Attach preconditioner solve and setup functions */
  flag = CVodeSetPreconditioner(cvode_mem, CVBandPrecSetup, CVBandPrecSolve);
  return (flag);
}